

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void initoptions(void)

{
  int local_c;
  int i;
  
  iflags.travelcc.y = -1;
  iflags.travelcc.x = -1;
  flags.warntype = 0;
  builtin_strncpy(flags.inv_order,"\f\x05\x02\x03\a\t\n\b\x04\v\x06\r\x0e\x0f\x10",0x10);
  flags.inv_order[0x10] = '\0';
  flags.inv_order[0x11] = '\0';
  fruitadd("slime mold");
  strncpy(pl_fruit,"slime mold",0x20);
  local_c = 0;
  while (birth_options[local_c].name != (char *)0x0) {
    nh_set_option(birth_options[local_c].name,birth_options[local_c].value,'\0');
    local_c = local_c + 1;
  }
  local_c = 0;
  while (options[local_c].name != (char *)0x0) {
    nh_set_option(options[local_c].name,options[local_c].value,'\0');
    local_c = local_c + 1;
  }
  if (active_birth_options == (nh_option_desc *)0x0) {
    active_birth_options = clone_optlist(birth_options);
  }
  else {
    local_c = 0;
    while (active_birth_options[local_c].name != (char *)0x0) {
      nh_set_option(active_birth_options[local_c].name,active_birth_options[local_c].value,'\0');
      local_c = local_c + 1;
    }
  }
  return;
}

Assistant:

void initoptions(void)
{
	int i;
	
	iflags.travelcc.x = iflags.travelcc.y = -1;
	flags.warntype = 0L;

	/* init flags.inv_order this way, as setting it via the option
	 * requires a preexisting order */
	memcpy(flags.inv_order, def_inv_order, sizeof flags.inv_order);

	fruitadd(obj_descr[SLIME_MOLD].oc_name);
	strncpy(pl_fruit, obj_descr[SLIME_MOLD].oc_name, PL_FSIZ);

	/* init from option definitions */
	for (i = 0; birth_options[i].name; i++)
	    nh_set_option(birth_options[i].name, birth_options[i].value, FALSE);

	for (i = 0; options[i].name; i++)
	    nh_set_option(options[i].name, options[i].value, FALSE);

	if (!active_birth_options) {
	    /* at this point the user may no longer change their birth options.
	     * active_birth_options will recieve birth option changes made during
	     * log replay, so that we can show the user what birth options the
	     * loaded game was started with */
	    active_birth_options = clone_optlist(birth_options);
	} else {
	    /* the switch to alternate birth options has already happened,
	     * so make sure those settings are active instead. */
	    for (i = 0; active_birth_options[i].name; i++) {
		nh_set_option(active_birth_options[i].name,
			      active_birth_options[i].value, FALSE);
	    }
	}
}